

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_singlestep_exception(DisasContext_conflict1 *s)

{
  TCGContext_conflict1 *tcg_ctx;
  DisasContext_conflict1 *s_local;
  
  if ((s->ss_active & 1U) == 0) {
    gen_exception_internal(s->uc->tcg_ctx,0x10002);
  }
  else {
    gen_step_complete_exception(s);
  }
  return;
}

Assistant:

static void gen_singlestep_exception(DisasContext *s)
{
    /* Generate the right kind of exception for singlestep, which is
     * either the architectural singlestep or EXCP_DEBUG for QEMU's
     * gdb singlestepping.
     */
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (s->ss_active) {
        gen_step_complete_exception(s);
    } else {
        gen_exception_internal(tcg_ctx, EXCP_DEBUG);
    }
}